

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  SnapPromiseReactionTaskFunctionInfo *pSVar1;
  ScriptContext *ctx_00;
  JavascriptPromiseReaction *reaction_00;
  Var argument_00;
  JavascriptLibrary *this;
  RecyclableObject *pRVar2;
  Var argument;
  JavascriptPromiseReaction *reaction;
  ScriptContext *ctx;
  SnapPromiseReactionTaskFunctionInfo *rInfo;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)30>
                     (snpObject);
  ctx_00 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  reaction_00 = NSSnapValues::InflatePromiseReactionInfo(&pSVar1->Reaction,ctx_00,inflator);
  argument_00 = InflateMap::InflateTTDVar(inflator,pSVar1->Argument);
  this = Js::ScriptContext::GetLibrary(ctx_00);
  pRVar2 = Js::JavascriptLibrary::CreatePromiseReactionTaskFunction_TTD
                     (this,reaction_00,argument_00);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseReactionTaskFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseReactionTaskFunctionInfo* rInfo = SnapObjectGetAddtlInfoAs<SnapPromiseReactionTaskFunctionInfo*, SnapObjectType::SnapPromiseReactionTaskFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(&rInfo->Reaction, ctx, inflator);
            Js::Var argument = inflator->InflateTTDVar(rInfo->Argument);

            return ctx->GetLibrary()->CreatePromiseReactionTaskFunction_TTD(reaction, argument);
        }